

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O1

Time helics::fileops::loadJsonTime(json *timeElement,time_units defaultUnits)

{
  value_t vVar1;
  string_view unitString;
  string_view unitString_00;
  const_iterator cVar2;
  const_reference pvVar3;
  baseType bVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  char *extraout_RDX;
  string_view timeString;
  double ret;
  long *in_stack_ffffffffffffffb8;
  double dVar6;
  utilities *in_stack_ffffffffffffffc0;
  long local_38 [2];
  
  vVar1 = (timeElement->m_data).m_type;
  if (vVar1 - 5 < 2) {
    dVar6 = 0.0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
              (timeElement,(long *)&stack0xffffffffffffffb8);
LAB_00354a60:
    bVar4 = count_time<9,_long>::fromCount((int64_t)dVar6,defaultUnits);
  }
  else {
    if (vVar1 == number_float) {
      dVar6 = 0.0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                (timeElement,(double *)&stack0xffffffffffffffb8);
    }
    else {
      if (vVar1 != object) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&stack0xffffffffffffffb8,timeElement);
        timeString._M_str = extraout_RDX;
        timeString._M_len = (size_t)in_stack_ffffffffffffffb8;
        TVar5 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                          (in_stack_ffffffffffffffc0,timeString);
        if (in_stack_ffffffffffffffb8 == local_38) {
          return (Time)TVar5.internalTimeCode;
        }
        operator_delete(in_stack_ffffffffffffffb8,local_38[0] + 1);
        return (Time)TVar5.internalTimeCode;
      }
      cVar2 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(timeElement->m_data).m_value.object,(char (*) [5])0x3fb209);
      if ((_Rb_tree_header *)cVar2._M_node !=
          &(((timeElement->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
        pvVar3 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)timeElement,"unit");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&stack0xffffffffffffffb8,pvVar3);
        unitString._M_str = (char *)in_stack_ffffffffffffffc0;
        unitString._M_len = (size_t)in_stack_ffffffffffffffb8;
        defaultUnits = gmlc::utilities::timeUnitsFromString(unitString);
        if (in_stack_ffffffffffffffb8 != local_38) {
          operator_delete(in_stack_ffffffffffffffb8,local_38[0] + 1);
        }
      }
      if (((timeElement->m_data).m_type == object) &&
         (cVar2 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                  ::_M_find_tr<char[6],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              *)(timeElement->m_data).m_value.object,(char (*) [6])0x3fce06),
         (_Rb_tree_header *)cVar2._M_node !=
         &(((timeElement->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
        pvVar3 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)timeElement,"units");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&stack0xffffffffffffffb8,pvVar3);
        unitString_00._M_str = (char *)in_stack_ffffffffffffffc0;
        unitString_00._M_len = (size_t)in_stack_ffffffffffffffb8;
        defaultUnits = gmlc::utilities::timeUnitsFromString(unitString_00);
        if (in_stack_ffffffffffffffb8 != local_38) {
          operator_delete(in_stack_ffffffffffffffb8,local_38[0] + 1);
        }
      }
      if ((timeElement->m_data).m_type != object) {
        return (Time)-0x7fffffffffffffff;
      }
      cVar2 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[6],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(timeElement->m_data).m_value.object,(char (*) [6])0x3f9b99);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(((timeElement->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
        return (Time)-0x7fffffffffffffff;
      }
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"value");
      vVar1 = (pvVar3->m_data).m_type;
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"value");
      if ((byte)(vVar1 - number_integer) < 2) {
        dVar6 = 0.0;
        nlohmann::json_abi_v3_11_3::detail::
        get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
                  (pvVar3,(long *)&stack0xffffffffffffffb8);
        goto LAB_00354a60;
      }
      dVar6 = 0.0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                (pvVar3,(double *)&stack0xffffffffffffffb8);
    }
    bVar4 = -0x7fffffffffffffff;
    dVar6 = dVar6 * timeCountReverse[(int)defaultUnits];
    if (-9223372036.854765 < dVar6) {
      if (9223372036.854765 <= dVar6) {
        bVar4 = 0x7fffffffffffffff;
      }
      else {
        bVar4 = (baseType)
                (dVar6 * 1000000000.0 +
                *(double *)(&DAT_003d20a0 + (ulong)(0.0 <= dVar6 * 1000000000.0) * 8));
      }
    }
  }
  return (Time)bVar4;
}

Assistant:

helics::Time loadJsonTime(const nlohmann::json& timeElement, time_units defaultUnits)
{
    if (timeElement.is_object()) {
        if (timeElement.contains("unit")) {
            defaultUnits =
                gmlc::utilities::timeUnitsFromString(timeElement["unit"].get<std::string>());
        }
        if (timeElement.contains("units")) {
            defaultUnits =
                gmlc::utilities::timeUnitsFromString(timeElement["units"].get<std::string>());
        }
        if (timeElement.contains("value")) {
            if (timeElement["value"].is_number_integer()) {
                return {timeElement["value"].get<int64_t>(), defaultUnits};
            }
            return {timeElement["value"].get<double>() * toSecondMultiplier(defaultUnits)};
        }
        return helics::Time::minVal();
    }
    if (timeElement.is_number_integer() || timeElement.is_number_unsigned()) {
        return {timeElement.get<std::int64_t>(), defaultUnits};
    }
    if (timeElement.is_number_float()) {
        return {timeElement.get<double>() * toSecondMultiplier(defaultUnits)};
    }
    return gmlc::utilities::loadTimeFromString<helics::Time>(timeElement.get<std::string>());
}